

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

WrapPoint CharacterWrapPoint(tchar c)

{
  bool bVar1;
  int local_14;
  int i;
  tchar c_local;
  
  local_14 = 0;
  while( true ) {
    bVar1 = false;
    if (unicode4cat[local_14].code != 0) {
      bVar1 = unicode4cat[local_14].code <= (ulong)c;
    }
    if (!bVar1) break;
    if (unicode4cat[local_14].code == (ulong)c) {
      if ((unicode4cat[local_14].category == UCPS) || (unicode4cat[local_14].category == UCPI)) {
        i = 1;
      }
      else {
        i = 2;
      }
      return i;
    }
    local_14 = local_14 + 1;
  }
  return NoWrapPoint;
}

Assistant:

static WrapPoint CharacterWrapPoint(tchar c)
{
    int i;
    for (i = 0; unicode4cat[i].code && unicode4cat[i].code <= c; ++i)
        if (unicode4cat[i].code == c)
        {
            /* wrapping before opening punctuation and initial quotes */
            if (unicode4cat[i].category == UCPS ||
                unicode4cat[i].category == UCPI)
                return WrapBefore;
            /* else wrapping after this character */
            else
                return WrapAfter;
        }
    /* character has no effect on line wrapping */
    return NoWrapPoint;
}